

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O2

void __thiscall
OpenMD::Snapshot::Snapshot(Snapshot *this,int nAtoms,int nRigidbodies,int nCutoffGroups,bool usePBC)

{
  double local_80;
  RectMatrix<double,_3U,_3U> local_78;
  
  DataStorage::DataStorage(&this->atomData,(long)nAtoms,0);
  DataStorage::DataStorage(&this->rigidbodyData,(long)nRigidbodies,0);
  DataStorage::DataStorage(&this->cgData,(long)nCutoffGroups,1);
  FrameData::FrameData(&this->frameData);
  this->orthoTolerance_ = 1e-06;
  (this->frameData).id = -1;
  (this->frameData).currentTime = 0.0;
  RectMatrix<double,_3U,_3U>::RectMatrix(&local_78,0.0);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&(this->frameData).hmat,&local_78);
  RectMatrix<double,_3U,_3U>::RectMatrix(&local_78,0.0);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&(this->frameData).invHmat,&local_78);
  (this->frameData).orthoRhombic = false;
  (this->frameData).usePBC = usePBC;
  (this->frameData).bondPotential = 0.0;
  (this->frameData).bendPotential = 0.0;
  (this->frameData).torsionPotential = 0.0;
  (this->frameData).inversionPotential = 0.0;
  local_80 = 0.0;
  Vector<double,_7U>::Vector((Vector<double,_7U> *)&local_78,&local_80);
  Vector<double,_7U>::operator=(&(this->frameData).lrPotentials,(Vector<double,_7U> *)&local_78);
  (this->frameData).reciprocalPotential = 0.0;
  (this->frameData).surfacePotential = 0.0;
  local_80 = 0.0;
  Vector<double,_7U>::Vector((Vector<double,_7U> *)&local_78,&local_80);
  Vector<double,_7U>::operator=(&(this->frameData).selfPotentials,(Vector<double,_7U> *)&local_78);
  local_80 = 0.0;
  Vector<double,_7U>::Vector((Vector<double,_7U> *)&local_78,&local_80);
  Vector<double,_7U>::operator=
            (&(this->frameData).excludedPotentials,(Vector<double,_7U> *)&local_78);
  (this->frameData).restraintPotential = 0.0;
  (this->frameData).rawPotential = 0.0;
  (this->frameData).xyArea = 0.0;
  (this->frameData).xzArea = 0.0;
  (this->frameData).yzArea = 0.0;
  (this->frameData).volume = 0.0;
  (this->frameData).thermostat.first = 0.0;
  (this->frameData).thermostat.second = 0.0;
  (this->frameData).electronicThermostat.first = 0.0;
  (this->frameData).electronicThermostat.second = 0.0;
  RectMatrix<double,_3U,_3U>::RectMatrix(&local_78,0.0);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&(this->frameData).barostat,&local_78);
  RectMatrix<double,_3U,_3U>::RectMatrix(&local_78,0.0);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&(this->frameData).virialTensor,&local_78);
  Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_78);
  local_78.data_[0][0] = 0.0;
  local_78.data_[0][1] = 0.0;
  local_78.data_[0][2] = 0.0;
  Vector<double,_3U>::operator=
            (&(this->frameData).conductiveHeatFlux.super_Vector<double,_3U>,
             (Vector<double,_3U> *)&local_78);
  std::make_shared<OpenMD::SPFData>();
  std::__shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->frameData).spfData.
              super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2> *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78.data_[0] + 1));
  clearDerivedProperties(this);
  return;
}

Assistant:

Snapshot::Snapshot(int nAtoms, int nRigidbodies, int nCutoffGroups,
                     bool usePBC) :
      atomData(nAtoms),
      rigidbodyData(nRigidbodies),
      cgData(nCutoffGroups, DataStorage::dslPosition), orthoTolerance_(1e-6) {
    frameData.id                   = -1;
    frameData.currentTime          = 0;
    frameData.hmat                 = Mat3x3d(0.0);
    frameData.invHmat              = Mat3x3d(0.0);
    frameData.orthoRhombic         = false;
    frameData.usePBC               = usePBC;
    frameData.bondPotential        = 0.0;
    frameData.bendPotential        = 0.0;
    frameData.torsionPotential     = 0.0;
    frameData.inversionPotential   = 0.0;
    frameData.lrPotentials         = potVec(0.0);
    frameData.surfacePotential     = 0.0;
    frameData.reciprocalPotential  = 0.0;
    frameData.selfPotentials       = potVec(0.0);
    frameData.excludedPotentials   = potVec(0.0);
    frameData.restraintPotential   = 0.0;
    frameData.rawPotential         = 0.0;
    frameData.xyArea               = 0.0;
    frameData.xzArea               = 0.0;
    frameData.yzArea               = 0.0;
    frameData.volume               = 0.0;
    frameData.thermostat           = make_pair(0.0, 0.0);
    frameData.electronicThermostat = make_pair(0.0, 0.0);
    frameData.barostat             = Mat3x3d(0.0);
    frameData.virialTensor         = Mat3x3d(0.0);
    frameData.conductiveHeatFlux   = Vector3d(0.0, 0.0, 0.0);
    frameData.spfData              = std::make_shared<SPFData>();
    clearDerivedProperties();
  }